

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiann.cpp
# Opt level: O2

void __thiscall MultiANN::ResetMultiANN(MultiANN *this)

{
  ANN *this_00;
  int k;
  long lVar1;
  
  for (lVar1 = 0; lVar1 != 0x1f; lVar1 = lVar1 + 1) {
    this_00 = this->AnnArray[lVar1];
    if (this_00 != (ANN *)0x0) {
      ANN::~ANN(this_00);
      operator_delete(this_00);
    }
    this->AnnArray[lVar1] = (ANN *)0x0;
  }
  annDeallocPts(&this->points_coor);
  if (this->points_ptr != (void **)0x0) {
    operator_delete__(this->points_ptr);
  }
  annDeallocPt(&this->scaling);
  if (this->topology != (int *)0x0) {
    operator_delete__(this->topology);
    return;
  }
  return;
}

Assistant:

void MultiANN::ResetMultiANN()  // destroys all the arrays of data points
{
    for (int k = 0; k < ANN_MAXIMUM_INDEX + 1; k++) {
        if (AnnArray[k]) delete (AnnArray[k]);
        AnnArray[k] = NULL;
    }
    annDeallocPts(points_coor);  // deallocate coordinates of data points
    delete[] points_ptr;         // deallocate pointers to data points
    annDeallocPt(scaling);       // deallocate scaling
    delete[] topology;           // deallocate topology
}